

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lclin.cpp
# Opt level: O2

double __thiscall libDAI::LCLin::run(LCLin *this)

{
  _func_int *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  undefined4 extraout_var_02;
  ulong uVar5;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  size_t i;
  ulong uVar6;
  size_t i_1;
  size_t k;
  double dVar7;
  Real x;
  allocator_type local_a9;
  double local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> update_seq;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  Diffs diffs;
  value_type_conflict2 local_38;
  
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Starting ");
    (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(&diffs,this);
    poVar3 = std::operator<<(poVar3,(string *)&diffs);
    std::operator<<(poVar3,"...");
    std::__cxx11::string::~string((string *)&diffs);
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (1 < CONCAT44(extraout_var_00,iVar2)) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  local_a8 = (double)toc();
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))
                    ((long *)CONCAT44(extraout_var_01,iVar2));
  Diffs::Diffs(&diffs,lVar4,1.0);
  dVar7 = InitCavityDists(this,&(this->Props).cavainame,&(this->Props).cavaiopts);
  if (this->_maxdiff < dVar7) {
    this->_maxdiff = dVar7;
  }
  lVar4 = 0;
  uVar6 = 0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  old_beliefs.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x28))
                      ((long *)CONCAT44(extraout_var_02,iVar2));
    if (uVar5 <= uVar6) break;
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::push_back
              (&old_beliefs,
               (value_type *)
               ((long)&(((this->_beliefs).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4));
    uVar6 = uVar6 + 1;
    lVar4 = lVar4 + 0x38;
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  local_38 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&update_seq,
             *(long *)(CONCAT44(extraout_var_03,iVar2) + 0x48) -
             *(long *)(CONCAT44(extraout_var_03,iVar2) + 0x40) >> 4,&local_38,&local_a9);
  uVar6 = 0;
  while( true ) {
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    if ((ulong)(*(long *)(CONCAT44(extraout_var_04,iVar2) + 0x48) -
                *(long *)(CONCAT44(extraout_var_04,iVar2) + 0x40) >> 4) <= uVar6) break;
    update_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = uVar6;
    uVar6 = uVar6 + 1;
  }
  uVar6 = 0;
  while (this->_iterations = uVar6, uVar6 < (this->Props).maxiter) {
    dVar7 = Diffs::max(&diffs);
    if (dVar7 <= (this->Props).tol) break;
    if ((this->Props).updates.v == SEQRND) {
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )update_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )update_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
    }
    uVar6 = 0;
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      if ((ulong)(*(long *)(CONCAT44(extraout_var_05,iVar2) + 0x48) -
                  *(long *)(CONCAT44(extraout_var_05,iVar2) + 0x40) >> 4) <= uVar6) break;
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar4 = *(long *)(CONCAT44(extraout_var_06,iVar2) + 0x40);
      update(this,*(size_t *)
                   (lVar4 + update_seq.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar6] * 0x10),
             *(size_t *)
              (lVar4 + 8 +
              update_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6] * 0x10));
      uVar6 = uVar6 + 1;
    }
    lVar4 = 0;
    uVar6 = 0;
    while( true ) {
      iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar2) + 0x28))
                        ((long *)CONCAT44(extraout_var_07,iVar2));
      if (uVar5 <= uVar6) break;
      CalcBelief(this,uVar6);
      x = dist((TFactor<double> *)
               ((long)&(((this->_beliefs).
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),
               (TFactor<double> *)
               ((long)&((old_beliefs.
                         super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                       super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar4),DISTLINF);
      Diffs::push(&diffs,x);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&((old_beliefs.
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4),
                 (TFactor<double> *)
                 ((long)&(((this->_beliefs).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4));
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x38;
    }
    iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
    if (2 < CONCAT44(extraout_var_08,iVar2)) {
      poVar3 = std::operator<<((ostream *)&std::cout,Name);
      std::operator<<(poVar3,"::run:  maxdiff ");
      dVar7 = Diffs::max(&diffs);
      poVar3 = std::ostream::_M_insert<double>(dVar7);
      poVar3 = std::operator<<(poVar3," after ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," passes");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    uVar6 = this->_iterations + 1;
  }
  dVar7 = Diffs::max(&diffs);
  if (this->_maxdiff < dVar7) {
    dVar7 = Diffs::max(&diffs);
    this->_maxdiff = dVar7;
  }
  iVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (CONCAT44(extraout_var_09,iVar2) != 0) {
    dVar7 = Diffs::max(&diffs);
    p_Var1 = (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6];
    if (dVar7 <= (this->Props).tol) {
      iVar2 = (*p_Var1)(this);
      if (1 < CONCAT44(extraout_var_11,iVar2)) {
        poVar3 = std::operator<<((ostream *)&std::cout,Name);
        std::operator<<(poVar3,"::run:  ");
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"converged in ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," passes (");
      toc();
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," clocks).");
    }
    else {
      iVar2 = (*p_Var1)(this);
      if (CONCAT44(extraout_var_10,iVar2) == 1) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      poVar3 = std::operator<<((ostream *)&std::cout,Name);
      poVar3 = std::operator<<(poVar3,"::run:  WARNING: not converged within ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," passes (");
      toc();
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3," clocks)...final maxdiff:");
      dVar7 = Diffs::max(&diffs);
      poVar3 = std::ostream::_M_insert<double>(dVar7);
    }
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_a8 = Diffs::max(&diffs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&update_seq.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&old_beliefs);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&diffs);
  return local_a8;
}

Assistant:

double LCLin::run() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 2 )
            cout << endl;

        clock_t tic = toc();
        Diffs diffs(grm().nrVars(), 1.0);

        double md = InitCavityDists(Props.cavainame, Props.cavaiopts);
        if( md > _maxdiff )
            _maxdiff = md;

        vector<Factor> old_beliefs;
        for(size_t i=0; i < grm().nrVars(); i++ )
            old_beliefs.push_back(beliefV(i));

        vector<size_t> update_seq(grm().nrEdges(),0);
        for( size_t k=0; k < grm().nrEdges(); k++ )
            update_seq[k] = k;

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            // Sequential updates
            if( Props.updates == UpdateType::SEQRND )
                random_shuffle( update_seq.begin(), update_seq.end() );
            
            for( size_t t=0; t < grm().nrEdges(); t++ ) {
                FactorGraph::edge_type iI = grm().edge(update_seq[t]);
                update( iI.first, iI.second );
            }

            // compare new beliefs with old ones
            for(size_t i=0; i < grm().nrVars(); i++ ) {
                CalcBelief(i);
                diffs.push( dist( beliefV(i), old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = beliefV(i);
            }

            if( Verbose() >= 3 )
                cout << Name << "::run:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                    cout << Name << "::run:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << Name << "::run:  ";
                    cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }